

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsChecker.cpp
# Opt level: O2

bool __thiscall DatUnpacker::ArgumentsChecker::checkSource(ArgumentsChecker *this,string *source)

{
  bool bVar1;
  path pStack_48;
  
  if (source->_M_string_length == 0) {
    std::__cxx11::string::assign((char *)this);
  }
  else {
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&pStack_48,source,auto_format);
    bVar1 = std::filesystem::is_regular_file(&pStack_48);
    std::filesystem::__cxx11::path::~path(&pStack_48);
    if (bVar1) {
      return true;
    }
    std::operator+(&pStack_48._M_pathname,"DAT file not found: ",source);
    std::__cxx11::string::operator=((string *)this,(string *)&pStack_48);
    std::__cxx11::string::~string((string *)&pStack_48);
  }
  return false;
}

Assistant:

bool ArgumentsChecker::checkSource(const std::string& source) {
        if (source.length() == 0) {
            _errorMessage = "Path to DAT file not specified";
            return false;
        }

        if (!std::filesystem::is_regular_file(source)) {
            _errorMessage = "DAT file not found: " + source;
            return false;
        }

        return true;
    }